

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void BUFFER_delete(BUFFER_HANDLE handle)

{
  if (handle != (BUFFER_HANDLE)0x0) {
    if (handle->buffer != (uchar *)0x0) {
      free(handle->buffer);
    }
    free(handle);
    return;
  }
  return;
}

Assistant:

void BUFFER_delete(BUFFER_HANDLE handle)
{
    /* Codes_SRS_BUFFER_07_004: [BUFFER_delete shall not delete any BUFFER_HANDLE that is NULL.] */
    if (handle != NULL)
    {
        BUFFER* b = (BUFFER*)handle;
        if (b->buffer != NULL)
        {
            /* Codes_SRS_BUFFER_07_003: [BUFFER_delete shall delete the data associated with the BUFFER_HANDLE along with the Buffer.] */
            free(b->buffer);
        }
        free(b);
    }
}